

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cpp
# Opt level: O0

void __thiscall Refal2::CScanner::preprocessingPlusAfterLineFeed(CScanner *this,char c)

{
  bool bVar1;
  char c_local;
  CScanner *this_local;
  
  if (c != '\n') {
    if (c == '*') {
      this->savedPreprocessingState = PS_PlusAfterLineFeed;
      this->preprocessingState = PS_SingleLineComment;
    }
    else if (c == ';') {
      warning(this,W_Semicolon,';');
    }
    else if (c == '{') {
      this->savedPreprocessingState = PS_PlusAfterLineFeed;
      this->preprocessingState = PS_MultilineComment;
    }
    else {
      bVar1 = IsSpace(c);
      if (!bVar1) {
        this->preprocessingState = PS_Initial;
        preprocessing(this,c);
      }
    }
  }
  return;
}

Assistant:

void CScanner::preprocessingPlusAfterLineFeed( char c )
{
	switch( c ) {
		case Semicolon:
			warning( W_Semicolon, c );
			break;
		case LineFeed:
			break;
		case SingleLineCommentBegin:
			savedPreprocessingState = PS_PlusAfterLineFeed;
			preprocessingState = PS_SingleLineComment;
			break;
		case MultilineCommentBegin:
			savedPreprocessingState = PS_PlusAfterLineFeed;
			preprocessingState = PS_MultilineComment;
			break;
		default:
			if( !IsSpace( c ) ) {
				preprocessingState = PS_Initial;
				preprocessing( c );
			}
			break;
	}
}